

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

StateSet *
Omega_h::get_epsilon_closure(StateSet *__return_storage_ptr__,StateSet *ss,FiniteAutomaton *fa)

{
  bool bVar1;
  reference piVar2;
  reference pvVar3;
  size_type sVar4;
  int local_b0;
  int local_ac;
  int next_state;
  int epsilon;
  value_type state_1;
  int epsilon1;
  int epsilon0;
  int local_8c;
  iterator iStack_88;
  int state;
  iterator __end1;
  iterator __begin1;
  StateSet *__range1;
  StateQueue q;
  FiniteAutomaton *fa_local;
  StateSet *ss_local;
  
  q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_node
       = (_Map_pointer)fa;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)&__range1);
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(ss);
  iStack_88 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(ss);
  while (bVar1 = std::operator!=(&__end1,&stack0xffffffffffffff78), bVar1) {
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    local_8c = *piVar2;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&__range1,&local_8c);
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  state_1 = get_epsilon0((FiniteAutomaton *)
                         q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node);
  epsilon = get_epsilon1((FiniteAutomaton *)
                         q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node);
  while (bVar1 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&__range1),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&__range1);
    next_state = *pvVar3;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&__range1);
    for (local_ac = state_1; local_ac <= epsilon; local_ac = local_ac + 1) {
      local_b0 = step((FiniteAutomaton *)
                      q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node,next_state,local_ac);
      if ((local_b0 != -1) &&
         (sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(ss,&local_b0),
         sVar4 == 0)) {
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert(ss,&local_b0);
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&__range1,&local_b0);
      }
    }
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(__return_storage_ptr__,ss);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

static StateSet get_epsilon_closure(StateSet ss, FiniteAutomaton const& fa) {
  StateQueue q;
  for (auto state : ss) q.push(state);
  auto epsilon0 = get_epsilon0(fa);
  auto epsilon1 = get_epsilon1(fa);
  while (!q.empty()) {
    auto state = q.front();
    q.pop();
    for (auto epsilon = epsilon0; epsilon <= epsilon1; ++epsilon) {
      auto next_state = step(fa, state, epsilon);
      if (next_state == -1) continue;
      if (!ss.count(next_state)) {
        ss.insert(next_state);
        q.push(next_state);
      }
    }
  }
  return ss;
}